

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::variable_storage_requires_stage_io(CompilerMSL *this,StorageClass storage)

{
  byte bVar1;
  ExecutionModel EVar2;
  
  if (storage == Input) {
    EVar2 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar2 != ExecutionModelTessellationControl) ||
       ((this->msl_options).multi_patch_workgroup == false)) {
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      bVar1 = (this->msl_options).raw_buffer_tese_input ^ 1U |
              EVar2 != ExecutionModelTessellationEvaluation;
      goto LAB_002856d6;
    }
  }
  else if (storage == Output) {
    bVar1 = this->capture_output_to_buffer ^ 1;
    goto LAB_002856d6;
  }
  bVar1 = 0;
LAB_002856d6:
  return (bool)(bVar1 & 1);
}

Assistant:

bool CompilerMSL::variable_storage_requires_stage_io(spv::StorageClass storage) const
{
	if (storage == StorageClassOutput)
		return !capture_output_to_buffer;
	else if (storage == StorageClassInput)
		return !(is_tesc_shader() && msl_options.multi_patch_workgroup) &&
		       !(is_tese_shader() && msl_options.raw_buffer_tese_input);
	else
		return false;
}